

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O0

int median_cut(j_decompress_ptr cinfo,boxptr boxlist,int numboxes,int desired_colors)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  boxptr boxp;
  int in_ECX;
  int in_EDX;
  boxptr in_RSI;
  j_decompress_ptr in_RDI;
  boxptr b2;
  boxptr b1;
  int cmax;
  int c2;
  int c1;
  int c0;
  int lb;
  int n;
  boxptr local_38;
  int local_30;
  int local_14;
  
  local_14 = in_EDX;
  while( true ) {
    if (in_ECX <= local_14) {
      return local_14;
    }
    if (in_ECX < local_14 * 2) {
      local_38 = find_biggest_volume(in_RSI,local_14);
    }
    else {
      local_38 = find_biggest_color_pop(in_RSI,local_14);
    }
    if (local_38 == (boxptr)0x0) break;
    boxp = in_RSI + local_14;
    boxp->c0max = local_38->c0max;
    boxp->c1max = local_38->c1max;
    boxp->c2max = local_38->c2max;
    boxp->c0min = local_38->c0min;
    boxp->c1min = local_38->c1min;
    boxp->c2min = local_38->c2min;
    iVar2 = (local_38->c0max - local_38->c0min) * 8 * c_scales[rgb_red[in_RDI->out_color_space]];
    iVar3 = (local_38->c1max - local_38->c1min) * 4 * c_scales[rgb_green[in_RDI->out_color_space]];
    iVar4 = (local_38->c2max - local_38->c2min) * 8 * c_scales[rgb_blue[in_RDI->out_color_space]];
    local_30 = iVar3;
    if (rgb_red[in_RDI->out_color_space] == 0) {
      if (iVar3 < iVar2) {
        local_30 = iVar2;
      }
      cVar1 = iVar3 >= iVar2;
      if (local_30 < iVar4) {
        cVar1 = '\x02';
      }
    }
    else {
      cVar1 = '\x01';
      if (iVar3 < iVar4) {
        cVar1 = '\x02';
        local_30 = iVar4;
      }
      if (local_30 < iVar2) {
        cVar1 = '\0';
      }
    }
    if (cVar1 == '\0') {
      iVar2 = (local_38->c0max + local_38->c0min) / 2;
      local_38->c0max = iVar2;
      boxp->c0min = iVar2 + 1;
    }
    else if (cVar1 == '\x01') {
      iVar2 = (local_38->c1max + local_38->c1min) / 2;
      local_38->c1max = iVar2;
      boxp->c1min = iVar2 + 1;
    }
    else if (cVar1 == '\x02') {
      iVar2 = (local_38->c2max + local_38->c2min) / 2;
      local_38->c2max = iVar2;
      boxp->c2min = iVar2 + 1;
    }
    update_box(in_RDI,local_38);
    update_box(in_RDI,boxp);
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

LOCAL(int)
median_cut(j_decompress_ptr cinfo, boxptr boxlist, int numboxes,
           int desired_colors)
/* Repeatedly select and split the largest box until we have enough boxes */
{
  int n, lb;
  int c0, c1, c2, cmax;
  register boxptr b1, b2;

  while (numboxes < desired_colors) {
    /* Select box to split.
     * Current algorithm: by population for first half, then by volume.
     */
    if (numboxes * 2 <= desired_colors) {
      b1 = find_biggest_color_pop(boxlist, numboxes);
    } else {
      b1 = find_biggest_volume(boxlist, numboxes);
    }
    if (b1 == NULL)             /* no splittable boxes left! */
      break;
    b2 = &boxlist[numboxes];    /* where new box will go */
    /* Copy the color bounds to the new box. */
    b2->c0max = b1->c0max;  b2->c1max = b1->c1max;  b2->c2max = b1->c2max;
    b2->c0min = b1->c0min;  b2->c1min = b1->c1min;  b2->c2min = b1->c2min;
    /* Choose which axis to split the box on.
     * Current algorithm: longest scaled axis.
     * See notes in update_box about scaling distances.
     */
    c0 = ((b1->c0max - b1->c0min) << C0_SHIFT) * C0_SCALE;
    c1 = ((b1->c1max - b1->c1min) << C1_SHIFT) * C1_SCALE;
    c2 = ((b1->c2max - b1->c2min) << C2_SHIFT) * C2_SCALE;
    /* We want to break any ties in favor of green, then red, blue last.
     * This code does the right thing for R,G,B or B,G,R color orders only.
     */
    if (rgb_red[cinfo->out_color_space] == 0) {
      cmax = c1;  n = 1;
      if (c0 > cmax) { cmax = c0;  n = 0; }
      if (c2 > cmax) { n = 2; }
    } else {
      cmax = c1;  n = 1;
      if (c2 > cmax) { cmax = c2;  n = 2; }
      if (c0 > cmax) { n = 0; }
    }
    /* Choose split point along selected axis, and update box bounds.
     * Current algorithm: split at halfway point.
     * (Since the box has been shrunk to minimum volume,
     * any split will produce two nonempty subboxes.)
     * Note that lb value is max for lower box, so must be < old max.
     */
    switch (n) {
    case 0:
      lb = (b1->c0max + b1->c0min) / 2;
      b1->c0max = lb;
      b2->c0min = lb + 1;
      break;
    case 1:
      lb = (b1->c1max + b1->c1min) / 2;
      b1->c1max = lb;
      b2->c1min = lb + 1;
      break;
    case 2:
      lb = (b1->c2max + b1->c2min) / 2;
      b1->c2max = lb;
      b2->c2min = lb + 1;
      break;
    }
    /* Update stats for boxes */
    update_box(cinfo, b1);
    update_box(cinfo, b2);
    numboxes++;
  }
  return numboxes;
}